

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr_bounds.h
# Opt level: O1

PreprocessInfoStd * __thiscall
mp::
BoundComputations<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
::ComputeBoundsAndType
          (PreprocessInfoStd *__return_storage_ptr__,
          BoundComputations<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
          *this,LinTerms *lt)

{
  double __x;
  double dVar1;
  double dVar2;
  ptr pdVar3;
  ptr piVar4;
  long lVar5;
  BoundComputations<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  *pBVar6;
  BoundComputations<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  *pBVar7;
  long lVar8;
  size_ty sVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  Type local_7c;
  
  dVar10 = 0.0;
  dVar13 = 0.0;
  __return_storage_ptr__->lb_ = 0.0;
  __return_storage_ptr__->ub_ = 0.0;
  __return_storage_ptr__->type_ = INTEGER;
  __return_storage_ptr__->result_var_ = -1;
  sVar9 = (lt->coefs_).super_small_vector_base<std::allocator<double>,_6U>.m_data.
          super_small_vector_data_base<double_*,_unsigned_long>.m_size;
  if (sVar9 == 0) {
    local_7c = INTEGER;
  }
  else {
    pdVar3 = (lt->coefs_).super_small_vector_base<std::allocator<double>,_6U>.m_data.
             super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr;
    piVar4 = (lt->vars_).super_small_vector_base<std::allocator<int>,_6U>.m_data.
             super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr;
    lVar5 = *(long *)(this + 0xa0);
    local_7c = INTEGER;
    do {
      __x = pdVar3[sVar9 - 1];
      pBVar7 = this + 0x58;
      pBVar6 = this + 0x40;
      if (__x < 0.0) {
        pBVar7 = this + 0x40;
        pBVar6 = this + 0x58;
      }
      lVar8 = (long)piVar4[sVar9 - 1];
      dVar1 = *(double *)(*(long *)pBVar6 + lVar8 * 8);
      dVar2 = *(double *)(*(long *)pBVar7 + lVar8 * 8);
      if (*(int *)(lVar5 + lVar8 * 4) == 1) {
        dVar11 = floor(__x);
        dVar12 = ceil(__x);
        if ((dVar11 != dVar12) || (NAN(dVar11) || NAN(dVar12))) goto LAB_003081db;
      }
      else {
LAB_003081db:
        local_7c = CONTINUOUS;
      }
      dVar10 = dVar10 + __x * dVar1;
      dVar13 = dVar13 + __x * dVar2;
      sVar9 = sVar9 - 1;
    } while (sVar9 != 0);
  }
  __return_storage_ptr__->lb_ = dVar10;
  __return_storage_ptr__->ub_ = dVar13;
  __return_storage_ptr__->type_ = local_7c;
  return __return_storage_ptr__;
}

Assistant:

PreprocessInfoStd ComputeBoundsAndType(const LinTerms& lt)
      const {
    PreprocessInfoStd result;
    result.lb_ = result.ub_ = 0.0;
    result.type_ = var::INTEGER;
    auto& model = MPCD( GetModel() );
    for (auto i=lt.size(); i--; ) {
      auto v = lt.var(i);
      auto c = lt.coef(i);
      if (c >= 0.0) {
        result.lb_ += c * model.lb(v);
        result.ub_ += c * model.ub(v);
      } else {
        result.lb_ += c * model.ub(v);
        result.ub_ += c * model.lb(v);
      }
      if (var::INTEGER!=model.var_type(v)
          || !is_integer(c)) {
        result.type_=var::CONTINUOUS;
      }
    }
    return result;
  }